

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::
emplaceRealloc<slang::ast::CaseAssertionExpr::ItemGroup>
          (SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup> *this,pointer pos,
          ItemGroup *args)

{
  ulong uVar1;
  size_type sVar2;
  undefined8 *puVar3;
  size_type sVar4;
  pointer pIVar5;
  pointer pIVar6;
  ItemGroup *__cur;
  pointer pIVar7;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  ctx = (EVP_PKEY_CTX *)0x18;
  pIVar5 = (pointer)detail::allocArray(capacity,0x18);
  *(AssertionExpr **)((long)pIVar5 + lVar8 + 0x10) = (args->body).ptr;
  sVar2 = (args->expressions).size_;
  *(undefined8 *)((long)pIVar5 + lVar8) = (args->expressions).data_;
  ((undefined8 *)((long)pIVar5 + lVar8))[1] = sVar2;
  pIVar6 = this->data_;
  pIVar7 = pIVar5;
  if (pIVar6 + this->len == pos) {
    for (; pIVar6 != pos; pIVar6 = pIVar6 + 1) {
      (pIVar7->body).ptr = (pIVar6->body).ptr;
      sVar2 = (pIVar6->expressions).size_;
      (pIVar7->expressions).data_ = (pIVar6->expressions).data_;
      (pIVar7->expressions).size_ = sVar2;
      pIVar7 = pIVar7 + 1;
    }
  }
  else {
    for (; pIVar6 != pos; pIVar6 = pIVar6 + 1) {
      (pIVar7->body).ptr = (pIVar6->body).ptr;
      sVar2 = (pIVar6->expressions).size_;
      (pIVar7->expressions).data_ = (pIVar6->expressions).data_;
      (pIVar7->expressions).size_ = sVar2;
      pIVar7 = pIVar7 + 1;
    }
    sVar2 = this->len;
    pIVar6 = this->data_;
    puVar3 = (undefined8 *)((long)pIVar5 + lVar8);
    for (; pos != pIVar6 + sVar2; pos = pos + 1) {
      puVar3[5] = (pos->body).ptr;
      sVar4 = (pos->expressions).size_;
      puVar3[3] = (pos->expressions).data_;
      puVar3[4] = sVar4;
      puVar3 = puVar3 + 3;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pIVar5;
  return (pointer)((long)pIVar5 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}